

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF8ToUTF16(uchar *outb,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar5 = (int)outb;
  iVar6 = (int)in;
  if (in == (uchar *)0x0) {
    if (1 < *outlen) {
      outb[0] = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      return 2;
    }
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || outb == (uchar *)0x0)) {
    return -1;
  }
  if (in == (uchar *)0x0) {
    *outlen = 0;
    iVar6 = 0;
    iVar1 = 0;
  }
  else {
    pbVar7 = in + *inlen;
    pbVar8 = outb + ((long)*outlen & 0xfffffffffffffffe);
    iVar1 = -2;
    while (in < pbVar7) {
      bVar2 = *in;
      if ((char)bVar2 < '\0') {
        if (bVar2 < 0xe0) {
          if (bVar2 < 0xc2) goto LAB_0012d911;
          uVar3 = bVar2 & 0x1f;
          uVar4 = 0x80;
          lVar9 = 2;
        }
        else {
          lVar9 = 4 - (ulong)(bVar2 < 0xf0);
          uVar4 = 0x10000;
          if (bVar2 < 0xf0) {
            uVar4 = 0x800;
          }
          uVar3 = bVar2 & 0xf;
        }
        if ((long)pbVar7 - (long)in < lVar9) break;
        for (lVar10 = 1; lVar9 != lVar10; lVar10 = lVar10 + 1) {
          if ((in[lVar10] & 0xc0) != 0x80) goto LAB_0012d911;
          uVar3 = uVar3 << 6 | in[lVar10] & 0x3f;
        }
        if (((uVar3 < uVar4) || (0x10ffff < uVar3)) || ((uVar3 & 0xfffff800) == 0xd800))
        goto LAB_0012d911;
        bVar2 = (byte)(uVar3 >> 8);
        if (0xffff < uVar3) {
          if (3 < (long)pbVar8 - (long)outb) {
            *outb = (byte)(uVar3 - 0x10000 >> 10);
            outb[1] = (byte)(uVar3 - 0x10000 >> 0x12) | 0xd8;
            outb[2] = (byte)uVar3;
            bVar2 = bVar2 & 3 | 0xdc;
            lVar11 = 3;
            lVar10 = 4;
            goto LAB_0012d8ec;
          }
          goto LAB_0012d90c;
        }
        if (pbVar8 <= outb) goto LAB_0012d90c;
        *outb = (byte)uVar3;
        lVar11 = 1;
        lVar10 = 2;
LAB_0012d8ec:
        outb[lVar11] = bVar2;
        outb = outb + lVar10;
        in = in + lVar9;
      }
      else {
        if (pbVar8 <= outb) {
LAB_0012d90c:
          iVar1 = -3;
          goto LAB_0012d911;
        }
        *outb = bVar2;
        outb[1] = 0;
        in = in + 1;
        outb = outb + 2;
      }
    }
    iVar1 = (int)outb - iVar5;
LAB_0012d911:
    *outlen = (int)outb - iVar5;
    iVar6 = (int)in - iVar6;
  }
  *inlen = iVar6;
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen,
            void *vctxt ATTRIBUTE_UNUSED) {
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(outb, outlen, in, inlen, NULL));
}